

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

void sat_solver2_delete(sat_solver2 *s)

{
  int *piVar1;
  int **__ptr;
  Vec_Set_t *__ptr_00;
  Prf_Man_t *__ptr_01;
  Vec_Int_t *__ptr_02;
  Vec_Wrd_t *__ptr_03;
  word *__ptr_04;
  void *__ptr_05;
  int iVar2;
  veci *pvVar3;
  long lVar4;
  long lVar5;
  
  piVar1 = (s->order).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->order).ptr = (int *)0x0;
  }
  piVar1 = (s->trail_lim).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->trail_lim).ptr = (int *)0x0;
  }
  piVar1 = (s->tagged).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->tagged).ptr = (int *)0x0;
  }
  piVar1 = (s->stack).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->stack).ptr = (int *)0x0;
  }
  piVar1 = (s->temp_clause).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->temp_clause).ptr = (int *)0x0;
  }
  piVar1 = (s->temp_proof).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->temp_proof).ptr = (int *)0x0;
  }
  piVar1 = (s->conf_final).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->conf_final).ptr = (int *)0x0;
  }
  piVar1 = (s->mark_levels).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->mark_levels).ptr = (int *)0x0;
  }
  piVar1 = (s->min_lit_order).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->min_lit_order).ptr = (int *)0x0;
  }
  piVar1 = (s->min_step_order).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->min_step_order).ptr = (int *)0x0;
  }
  piVar1 = (s->act_clas).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->act_clas).ptr = (int *)0x0;
  }
  piVar1 = (s->claProofs).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->claProofs).ptr = (int *)0x0;
  }
  iVar2 = (s->Mem).nPagesAlloc;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      piVar1 = (s->Mem).pPages[lVar4];
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        (s->Mem).pPages[lVar4] = (int *)0x0;
        iVar2 = (s->Mem).nPagesAlloc;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  __ptr = (s->Mem).pPages;
  if (__ptr != (int **)0x0) {
    free(__ptr);
    (s->Mem).pPages = (int **)0x0;
  }
  __ptr_00 = s->pPrf1;
  if (__ptr_00 != (Vec_Set_t *)0x0) {
    iVar2 = __ptr_00->nPagesAlloc;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        if (__ptr_00->pPages[lVar4] != (word *)0x0) {
          free(__ptr_00->pPages[lVar4]);
          __ptr_00->pPages[lVar4] = (word *)0x0;
          iVar2 = __ptr_00->nPagesAlloc;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar2);
    }
    if (__ptr_00->pPages != (word **)0x0) {
      free(__ptr_00->pPages);
    }
    free(__ptr_00);
  }
  __ptr_01 = s->pPrf2;
  if (__ptr_01 != (Prf_Man_t *)0x0) {
    __ptr_02 = __ptr_01->vSaved;
    piVar1 = __ptr_02->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
    }
    free(__ptr_02);
    __ptr_03 = __ptr_01->vInfo;
    __ptr_04 = __ptr_03->pArray;
    if (__ptr_04 != (word *)0x0) {
      free(__ptr_04);
    }
    free(__ptr_03);
    free(__ptr_01);
  }
  Int2_ManStop(s->pInt2);
  if (s->vi == (varinfo2 *)0x0) goto LAB_004f7ec3;
  pvVar3 = s->wlists;
  if (pvVar3 != (veci *)0x0) {
    iVar2 = s->cap;
    if (0 < iVar2) {
      lVar4 = 8;
      lVar5 = 0;
      do {
        pvVar3 = s->wlists;
        __ptr_05 = *(void **)((long)&pvVar3->cap + lVar4);
        if (__ptr_05 != (void *)0x0) {
          free(__ptr_05);
          *(undefined8 *)((long)&pvVar3->cap + lVar4) = 0;
          iVar2 = s->cap;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar5 < iVar2 * 2);
      pvVar3 = s->wlists;
      if (pvVar3 == (veci *)0x0) goto LAB_004f7dc2;
    }
    free(pvVar3);
    s->wlists = (veci *)0x0;
  }
LAB_004f7dc2:
  if (s->vi != (varinfo2 *)0x0) {
    free(s->vi);
    s->vi = (varinfo2 *)0x0;
  }
  if (s->levels != (int *)0x0) {
    free(s->levels);
    s->levels = (int *)0x0;
  }
  if (s->assigns != (char *)0x0) {
    free(s->assigns);
    s->assigns = (char *)0x0;
  }
  if (s->trail != (lit *)0x0) {
    free(s->trail);
    s->trail = (lit *)0x0;
  }
  if (s->orderpos != (int *)0x0) {
    free(s->orderpos);
    s->orderpos = (int *)0x0;
  }
  if (s->reasons != (cla *)0x0) {
    free(s->reasons);
    s->reasons = (cla *)0x0;
  }
  if (s->units != (cla *)0x0) {
    free(s->units);
    s->units = (cla *)0x0;
  }
  if (s->activity != (uint *)0x0) {
    free(s->activity);
    s->activity = (uint *)0x0;
  }
  if (s->activity2 != (uint *)0x0) {
    free(s->activity2);
    s->activity2 = (uint *)0x0;
  }
  if (s->model != (int *)0x0) {
    free(s->model);
  }
LAB_004f7ec3:
  free(s);
  return;
}

Assistant:

void sat_solver2_delete(sat_solver2* s)
{
    int fVerify = 0;
    if ( fVerify )
    {
        veci * pCore = (veci *)Sat_ProofCore( s );
//        Abc_Print(1, "UNSAT core contains %d clauses (%6.2f %%).\n", veci_size(pCore), 100.0*veci_size(pCore)/veci_size(&s->clauses) );
        veci_delete( pCore );
        ABC_FREE( pCore );
//        if ( s->fProofLogging )
//            Sat_ProofCheck( s );
    }

    // report statistics
//    Abc_Print(1, "Used %6.2f MB for proof-logging.   Unit clauses = %d.\n", 1.0 * Vec_ReportMemory(&s->Proofs) / (1<<20), s->nUnits );

    // delete vectors
    veci_delete(&s->order);
    veci_delete(&s->trail_lim);
    veci_delete(&s->tagged);
    veci_delete(&s->stack);
    veci_delete(&s->temp_clause);
    veci_delete(&s->temp_proof);
    veci_delete(&s->conf_final);
    veci_delete(&s->mark_levels);
    veci_delete(&s->min_lit_order);
    veci_delete(&s->min_step_order);
//    veci_delete(&s->learnt_live);
    veci_delete(&s->act_clas);
    veci_delete(&s->claProofs);
//    veci_delete(&s->clauses);
//    veci_delete(&s->lrns);
    Sat_MemFree_( &s->Mem );
//    veci_delete(&s->proofs);
    Vec_SetFree( s->pPrf1 );
    Prf_ManStop( s->pPrf2 );
    Int2_ManStop( s->pInt2 );

    // delete arrays
    if (s->vi != 0){
        int i;
        if ( s->wlists )
            for (i = 0; i < s->cap*2; i++)
                veci_delete(&s->wlists[i]);
        ABC_FREE(s->wlists   );
        ABC_FREE(s->vi       );
        ABC_FREE(s->levels   );
        ABC_FREE(s->assigns  );
        ABC_FREE(s->trail    );
        ABC_FREE(s->orderpos );
        ABC_FREE(s->reasons  );
        ABC_FREE(s->units    );
        ABC_FREE(s->activity );
        ABC_FREE(s->activity2);
        ABC_FREE(s->model    );
    }
    ABC_FREE(s);

//    Abc_PrintTime( 1, "Time", Time );
}